

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.c
# Opt level: O0

int scrypt_alg(char *pass,size_t passlen,uchar *salt,size_t saltlen,uint64_t N,uint64_t r,uint64_t p
              ,uint64_t maxmem,uchar *key,size_t keylen,EVP_MD *sha256,OSSL_LIB_CTX *libctx,
              char *propq)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong r_00;
  uint32_t *T_00;
  long lVar3;
  uint64_t N_00;
  char *func;
  ulong in_R8;
  ulong in_R9;
  uint32_t *in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  char *in_stack_00000018;
  size_t in_stack_00000030;
  uint64_t Vlen;
  uint64_t Blen;
  uint64_t i;
  uint32_t *T;
  uint32_t *V;
  uint32_t *X;
  uchar *B;
  int rv;
  EVP_MD *in_stack_00000188;
  int in_stack_00000190;
  int in_stack_00000194;
  uchar *in_stack_00000198;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  int in_stack_000001c0;
  uchar *in_stack_000001c8;
  OSSL_LIB_CTX *in_stack_000001d0;
  char *in_stack_000001d8;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  size_t num;
  char *in_stack_ffffffffffffff60;
  char *file;
  uint32_t *in_stack_ffffffffffffff68;
  uint32_t *X_00;
  uint32_t *B_00;
  int local_44;
  int local_c;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_44 = 0;
  if ((((in_R9 == 0) || (in_stack_00000008 == (uint32_t *)0x0)) || (in_R8 < 2)) ||
     ((in_R8 & in_R8 - 1) != 0)) {
    local_c = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R9;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3fffffff)) / auVar1,0) < in_stack_00000008) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
      ERR_set_error(6,0xac,(char *)0x0);
      local_c = 0;
    }
    else if ((in_R9 << 4 < 0x40) && ((ulong)(1L << ((byte)(in_R9 << 4) & 0x3f)) <= in_R8)) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
      ERR_set_error(6,0xac,(char *)0x0);
      local_c = 0;
    }
    else {
      r_00 = (long)in_stack_00000008 * 0x80 * in_R9;
      if (r_00 < 0x80000000) {
        T_00 = (uint32_t *)(in_R8 + 2);
        if ((uint32_t *)(0x1ffffffffffffff / in_R9) < T_00) {
          ERR_new();
          ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
          ERR_set_error(6,0xac,(char *)0x0);
          local_c = 0;
        }
        else {
          lVar3 = in_R9 * 0x20 * (in_R8 + 2);
          N_00 = lVar3 * 4;
          if (lVar3 * -4 - 1U < r_00) {
            ERR_new();
            ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
            ERR_set_error(6,0xac,(char *)0x0);
            local_c = 0;
          }
          else if (CONCAT44(in_stack_00000014,in_stack_00000010) < r_00 + N_00) {
            ERR_new();
            ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
            ERR_set_error(6,0xac,(char *)0x0);
            local_c = 0;
          }
          else if (in_stack_00000018 == (char *)0x0) {
            local_c = 1;
          }
          else {
            X_00 = in_stack_00000008;
            func = (char *)CRYPTO_malloc((int)r_00 + (int)N_00,
                                         "providers/implementations/kdfs/scrypt.c",0x1ea);
            if (func == (char *)0x0) {
              ERR_new();
              ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
              ERR_set_error(6,0xc0100,(char *)0x0);
              local_c = 0;
            }
            else {
              num = in_stack_00000030;
              file = (char *)Vlen;
              iVar2 = ossl_pkcs5_pbkdf2_hmac_ex
                                (in_stack_000001a8,in_stack_000001a4,in_stack_00000198,
                                 in_stack_00000194,in_stack_00000190,in_stack_00000188,
                                 in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                                 in_stack_000001d8);
              if (iVar2 != 0) {
                for (B_00 = (uint32_t *)0x0; B_00 < in_stack_00000008;
                    B_00 = (uint32_t *)((long)B_00 + 1)) {
                  scryptROMix((uchar *)B_00,r_00,N_00,X_00,T_00,in_stack_ffffffffffffff68);
                }
                iVar2 = ossl_pkcs5_pbkdf2_hmac_ex
                                  (in_stack_000001a8,in_stack_000001a4,in_stack_00000198,
                                   in_stack_00000194,in_stack_00000190,in_stack_00000188,
                                   in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                                   in_stack_000001d8);
                func = in_stack_00000018;
                num = in_stack_00000030;
                file = (char *)Vlen;
                if (iVar2 != 0) {
                  local_44 = 1;
                }
              }
              if (local_44 == 0) {
                ERR_new();
                ERR_set_debug(file,(int)(num >> 0x20),func);
                ERR_set_error(6,0xb5,(char *)0x0);
              }
              CRYPTO_clear_free(file,num,func,in_stack_ffffffffffffff4c);
              local_c = local_44;
            }
          }
        }
      }
      else {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50);
        ERR_set_error(6,0xac,(char *)0x0);
        local_c = 0;
      }
    }
  }
  return local_c;
}

Assistant:

static int scrypt_alg(const char *pass, size_t passlen,
                      const unsigned char *salt, size_t saltlen,
                      uint64_t N, uint64_t r, uint64_t p, uint64_t maxmem,
                      unsigned char *key, size_t keylen, EVP_MD *sha256,
                      OSSL_LIB_CTX *libctx, const char *propq)
{
    int rv = 0;
    unsigned char *B;
    uint32_t *X, *V, *T;
    uint64_t i, Blen, Vlen;

    /* Sanity check parameters */
    /* initial check, r,p must be non zero, N >= 2 and a power of 2 */
    if (r == 0 || p == 0 || N < 2 || (N & (N - 1)))
        return 0;
    /* Check p * r < SCRYPT_PR_MAX avoiding overflow */
    if (p > SCRYPT_PR_MAX / r) {
        ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
        return 0;
    }

    /*
     * Need to check N: if 2^(128 * r / 8) overflows limit this is
     * automatically satisfied since N <= UINT64_MAX.
     */

    if (16 * r <= LOG2_UINT64_MAX) {
        if (N >= (((uint64_t)1) << (16 * r))) {
            ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
            return 0;
        }
    }

    /* Memory checks: check total allocated buffer size fits in uint64_t */

    /*
     * B size in section 5 step 1.S
     * Note: we know p * 128 * r < UINT64_MAX because we already checked
     * p * r < SCRYPT_PR_MAX
     */
    Blen = p * 128 * r;
    /*
     * Yet we pass it as integer to PKCS5_PBKDF2_HMAC... [This would
     * have to be revised when/if PKCS5_PBKDF2_HMAC accepts size_t.]
     */
    if (Blen > INT_MAX) {
        ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
        return 0;
    }

    /*
     * Check 32 * r * (N + 2) * sizeof(uint32_t) fits in uint64_t
     * This is combined size V, X and T (section 4)
     */
    i = UINT64_MAX / (32 * sizeof(uint32_t));
    if (N + 2 > i / r) {
        ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
        return 0;
    }
    Vlen = 32 * r * (N + 2) * sizeof(uint32_t);

    /* check total allocated size fits in uint64_t */
    if (Blen > UINT64_MAX - Vlen) {
        ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
        return 0;
    }

    /* Check that the maximum memory doesn't exceed a size_t limits */
    if (maxmem > SIZE_MAX)
        maxmem = SIZE_MAX;

    if (Blen + Vlen > maxmem) {
        ERR_raise(ERR_LIB_EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
        return 0;
    }

    /* If no key return to indicate parameters are OK */
    if (key == NULL)
        return 1;

    B = OPENSSL_malloc((size_t)(Blen + Vlen));
    if (B == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    X = (uint32_t *)(B + Blen);
    T = X + 32 * r;
    V = T + 32 * r;
    if (ossl_pkcs5_pbkdf2_hmac_ex(pass, passlen, salt, saltlen, 1, sha256,
                                  (int)Blen, B, libctx, propq) == 0)
        goto err;

    for (i = 0; i < p; i++)
        scryptROMix(B + 128 * r * i, r, N, X, T, V);

    if (ossl_pkcs5_pbkdf2_hmac_ex(pass, passlen, B, (int)Blen, 1, sha256,
                                  keylen, key, libctx, propq) == 0)
        goto err;
    rv = 1;
 err:
    if (rv == 0)
        ERR_raise(ERR_LIB_EVP, EVP_R_PBKDF2_ERROR);

    OPENSSL_clear_free(B, (size_t)(Blen + Vlen));
    return rv;
}